

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall duckdb::CSVErrorHandler::ErrorIfAny(CSVErrorHandler *this)

{
  bool bVar1;
  reference pvVar2;
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::mutex::lock(&this->main_mutex);
  if ((this->ignore_errors == false) &&
     ((this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pvVar2 = vector<duckdb::CSVError,_true>::get<true>(&this->errors,0);
    bVar1 = CanGetLine(this,(pvVar2->error_info).boundary_idx);
    if (bVar1) {
      pvVar2 = vector<duckdb::CSVError,_true>::get<true>(&this->errors,0);
      ThrowError(this,pvVar2);
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Failed to get error information for boundary index",&local_41);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::ErrorIfAny() {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (ignore_errors || errors.empty()) {
		// Nothing to error
		return;
	}
	if (!CanGetLine(errors[0].error_info.boundary_idx)) {
		throw InternalException("Failed to get error information for boundary index");
	}
	ThrowError(errors[0]);
}